

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

tmsize_t TIFFReadRawTile1(TIFF *tif,uint32_t tile,void *buf,tmsize_t size,char *module)

{
  int iVar1;
  uint64_t uVar2;
  tmsize_t tVar3;
  long lVar4;
  uint64_t uVar5;
  long local_58;
  tmsize_t n;
  tmsize_t mb;
  tmsize_t ma;
  tmsize_t cc;
  char *module_local;
  tmsize_t size_local;
  void *buf_local;
  uint32_t tile_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20000) == 0) {
    tif_local = (TIFF *)size;
    if ((tif->tif_flags & 0x800) == 0) {
      uVar2 = TIFFGetStrileOffset(tif,tile);
      iVar1 = _TIFFSeekOK(tif,uVar2);
      if (iVar1 == 0) {
        TIFFErrorExtR(tif,module,"Seek error at row %u, col %u, tile %u",(ulong)tif->tif_row,
                      (ulong)tif->tif_col,(ulong)tile);
        tif_local = (TIFF *)0xffffffffffffffff;
      }
      else {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,buf,size);
        if (tVar3 != size) {
          TIFFErrorExtR(tif,module,"Read error at row %u, col %u; got %ld bytes, expected %ld",
                        (ulong)tif->tif_row,(ulong)tif->tif_col,tVar3,size);
          tif_local = (TIFF *)0xffffffffffffffff;
        }
      }
    }
    else {
      uVar2 = TIFFGetStrileOffset(tif,tile);
      lVar4 = uVar2 + size;
      uVar5 = TIFFGetStrileOffset(tif,tile);
      if ((uVar5 < 0x8000000000000000) && ((long)uVar2 <= tif->tif_size)) {
        if (((lVar4 < (long)uVar2) || (lVar4 < size)) || (local_58 = size, tif->tif_size < lVar4)) {
          local_58 = tif->tif_size - uVar2;
        }
      }
      else {
        local_58 = 0;
      }
      if (local_58 == size) {
        _TIFFmemcpy(buf,tif->tif_base + uVar2,size);
      }
      else {
        TIFFErrorExtR(tif,module,
                      "Read error at row %u, col %u, tile %u; got %ld bytes, expected %ld",
                      (ulong)tif->tif_row,(ulong)tif->tif_col,(ulong)tile,local_58,size);
        tif_local = (TIFF *)0xffffffffffffffff;
      }
    }
    return (tmsize_t)tif_local;
  }
  __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                ,0x444,"tmsize_t TIFFReadRawTile1(TIFF *, uint32_t, void *, tmsize_t, const char *)"
               );
}

Assistant:

static tmsize_t TIFFReadRawTile1(TIFF *tif, uint32_t tile, void *buf,
                                 tmsize_t size, const char *module)
{
    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    if (!isMapped(tif))
    {
        tmsize_t cc;

        if (!SeekOK(tif, TIFFGetStrileOffset(tif, tile)))
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at row %" PRIu32 ", col %" PRIu32
                          ", tile %" PRIu32,
                          tif->tif_row, tif->tif_col, tile);
            return ((tmsize_t)(-1));
        }
        cc = TIFFReadFile(tif, buf, size);
        if (cc != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at row %" PRIu32 ", col %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, tif->tif_col, cc, size);
            return ((tmsize_t)(-1));
        }
    }
    else
    {
        tmsize_t ma, mb;
        tmsize_t n;
        ma = (tmsize_t)TIFFGetStrileOffset(tif, tile);
        mb = ma + size;
        if ((TIFFGetStrileOffset(tif, tile) > (uint64_t)TIFF_TMSIZE_T_MAX) ||
            (ma > tif->tif_size))
            n = 0;
        else if ((mb < ma) || (mb < size) || (mb > tif->tif_size))
            n = tif->tif_size - ma;
        else
            n = size;
        if (n != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at row %" PRIu32 ", col %" PRIu32
                          ", tile %" PRIu32 "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, tif->tif_col, tile, n, size);
            return ((tmsize_t)(-1));
        }
        _TIFFmemcpy(buf, tif->tif_base + ma, size);
    }
    return (size);
}